

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O1

bool tcu::isGatherOffsetsResultValid<tcu::IntLookupPrecision,int>
               (ConstPixelBufferAccess *level,Sampler *sampler,IntLookupPrecision *prec,Vec2 *coord,
               int coordZ,int componentNdx,IVec2 (*offsets) [4],Vector<int,_4> *result)

{
  int size;
  bool bVar1;
  int ndx;
  int iVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  int offNdx;
  long lVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  Vector<bool,_4> res_2;
  Vector<bool,_4> res_1;
  Vector<int,_4> res;
  Vector<int,_4> color;
  Vec2 vBounds;
  Vec2 uBounds;
  int local_a4;
  int local_98;
  byte local_94 [4];
  int local_90;
  int local_8c;
  byte local_88 [8];
  int local_80;
  int local_7c;
  ConstPixelBufferAccess local_78;
  undefined8 uStack_50;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_38,sampler->normalizedCoords,(level->m_size).m_data[0],
             coord->m_data[0],(prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_40,sampler->normalizedCoords,(level->m_size).m_data[1],
             coord->m_data[1],(prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
  fVar8 = floorf(local_38 + -0.5);
  fVar9 = floorf(local_34 + -0.5);
  fVar10 = floorf(local_40 + -0.5);
  local_98 = (int)fVar10;
  fVar10 = floorf(local_3c + -0.5);
  local_80 = (int)fVar10;
  bVar1 = local_98 <= local_80;
  if (local_98 <= local_80) {
    local_90 = (int)fVar8;
    local_8c = (int)fVar9;
    size = (level->m_size).m_data[0];
    local_7c = (level->m_size).m_data[1];
    local_78.m_pitch.m_data._4_8_ = SEXT48(componentNdx);
    do {
      if (local_90 <= local_8c) {
        local_a4 = local_90;
        do {
          local_78.m_data = (void *)0x0;
          uStack_50 = 0;
          lVar7 = 0;
          do {
            iVar2 = TexVerifierUtil::wrap
                              (sampler->wrapS,(*offsets)[lVar7].m_data[0] + local_a4,size);
            iVar3 = TexVerifierUtil::wrap
                              (sampler->wrapT,(*offsets)[lVar7].m_data[1] + local_98,local_7c);
            if ((((iVar2 < 0) || ((level->m_size).m_data[0] <= iVar2)) || (iVar3 < 0)) ||
               ((((level->m_size).m_data[1] <= iVar3 || (coordZ < 0)) ||
                ((level->m_size).m_data[2] <= coordZ)))) {
              sampleTextureBorder<int>((tcu *)&local_78,&level->m_format,sampler);
            }
            else {
              ConstPixelBufferAccess::getPixelT<int>(&local_78,(int)level,iVar2,iVar3);
            }
            *(int *)((long)(&local_78.m_pitch + 1) + lVar7 * 4) =
                 local_78.m_size.m_data[local_78.m_pitch.m_data._4_8_ + -2];
            lVar7 = lVar7 + 1;
          } while (lVar7 != 4);
          local_78.m_format.order = R;
          local_78.m_format.type = SNORM_INT8;
          local_78.m_size.m_data[0] = 0;
          local_78.m_size.m_data[1] = 0;
          lVar7 = 0;
          do {
            iVar2 = *(int *)((long)(&local_78.m_pitch + 1) + lVar7 * 4);
            iVar3 = result->m_data[lVar7];
            iVar5 = iVar2 - iVar3;
            if (iVar2 - iVar3 == 0 || iVar2 < iVar3) {
              iVar5 = -(iVar2 - iVar3);
            }
            local_78.m_size.m_data[lVar7 + -2] = iVar5;
            lVar7 = lVar7 + 1;
          } while (lVar7 != 4);
          local_88[4] = 0;
          local_88[5] = 0;
          local_88[6] = 0;
          local_88[7] = 0;
          lVar7 = 0;
          do {
            local_88[lVar7 + 4] =
                 (uint)local_78.m_size.m_data[lVar7 + -2] <= (prec->colorThreshold).m_data[lVar7];
            lVar7 = lVar7 + 1;
          } while (lVar7 != 4);
          local_88[0] = 0;
          local_88[1] = 0;
          local_88[2] = 0;
          local_88[3] = 0;
          lVar7 = 0;
          do {
            local_88[lVar7] = (prec->colorMask).m_data[lVar7] ^ 1;
            lVar7 = lVar7 + 1;
          } while (lVar7 != 4);
          local_94[0] = 0;
          local_94[1] = 0;
          local_94[2] = 0;
          local_94[3] = 0;
          lVar7 = 0;
          do {
            local_94[lVar7] = local_88[lVar7] | local_88[lVar7 + 4];
            lVar7 = lVar7 + 1;
          } while (lVar7 != 4);
          if (local_94[0] != 0) {
            uVar4 = 0xffffffffffffffff;
            do {
              if (uVar4 == 2) {
                uVar6 = 3;
                break;
              }
              uVar6 = uVar4 + 1;
              lVar7 = uVar4 + 2;
              uVar4 = uVar6;
            } while (local_94[lVar7] != 0);
            if (2 < uVar6) {
              return bVar1;
            }
          }
          local_a4 = local_a4 + 1;
        } while (local_a4 <= local_8c);
      }
      local_98 = local_98 + 1;
      bVar1 = local_98 <= local_80;
    } while (local_98 <= local_80);
  }
  return bVar1;
}

Assistant:

static bool isGatherOffsetsResultValid (const ConstPixelBufferAccess&	level,
										const Sampler&					sampler,
										const PrecType&					prec,
										const Vec2&						coord,
										int								coordZ,
										int								componentNdx,
										const IVec2						(&offsets)[4],
										const Vector<ScalarType, 4>&	result)
{
	const Vec2	uBounds		= computeNonNormalizedCoordBounds(sampler.normalizedCoords, level.getWidth(), coord.x(), prec.coordBits.x(), prec.uvwBits.x());
	const Vec2	vBounds		= computeNonNormalizedCoordBounds(sampler.normalizedCoords, level.getHeight(), coord.y(), prec.coordBits.y(), prec.uvwBits.y());

	// Integer coordinate bounds for (x0, y0) - without wrap mode
	const int	minI		= deFloorFloatToInt32(uBounds.x()-0.5f);
	const int	maxI		= deFloorFloatToInt32(uBounds.y()-0.5f);
	const int	minJ		= deFloorFloatToInt32(vBounds.x()-0.5f);
	const int	maxJ		= deFloorFloatToInt32(vBounds.y()-0.5f);

	const int	w			= level.getWidth();
	const int	h			= level.getHeight();

	for (int j = minJ; j <= maxJ; j++)
	{
		for (int i = minI; i <= maxI; i++)
		{
			Vector<ScalarType, 4> color;
			for (int offNdx = 0; offNdx < 4; offNdx++)
			{
				// offNdx-th coordinate offset and then wrapped.
				const int x = wrap(sampler.wrapS, i+offsets[offNdx].x(), w);
				const int y = wrap(sampler.wrapT, j+offsets[offNdx].y(), h);
				color[offNdx] = lookup<ScalarType>(level, sampler, x, y, coordZ)[componentNdx];
			}

			if (isColorValid(prec, color, result))
				return true;
		}
	}

	return false;
}